

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrapper.hpp
# Opt level: O0

void __thiscall Diligent::FileWrapper::Open(FileWrapper *this,FileOpenAttribs *OpenAttribs)

{
  Char *Message;
  LinuxFile *pLVar1;
  undefined1 local_38 [8];
  string msg;
  FileOpenAttribs *OpenAttribs_local;
  FileWrapper *this_local;
  
  msg.field_2._8_8_ = OpenAttribs;
  if (this->m_pFile != (CFile *)0x0) {
    FormatString<char[30]>((string *)local_38,(char (*) [30])"Another file already attached");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Open",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FileWrapper.hpp"
               ,0x3e);
    std::__cxx11::string::~string((string *)local_38);
  }
  Close(this);
  pLVar1 = LinuxFileSystem::OpenFile((FileOpenAttribs *)msg.field_2._8_8_);
  this->m_pFile = pLVar1;
  return;
}

Assistant:

void Open(const FileOpenAttribs& OpenAttribs)
    {
        VERIFY(!m_pFile, "Another file already attached");
        Close();
        m_pFile = FileSystem::OpenFile(OpenAttribs);
    }